

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorMode *color;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  uchar *out_00;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  size_t __size;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  size_t bytewidth;
  size_t __size_00;
  byte bVar16;
  uint uVar17;
  uint local_298;
  ulong local_280;
  ulong local_250;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t local_138 [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  color = &info_png->color;
  uVar6 = (info_png->color).bitdepth;
  uVar5 = getNumColorChannels((info_png->color).colortype);
  uVar5 = uVar5 * uVar6;
  uVar12 = (ulong)uVar5;
  if (info_png->interlace_method == 0) {
    sVar10 = w * uVar12;
    __size_00 = (sVar10 + 7 >> 3) * (ulong)h;
    __size = h + __size_00;
    *outsize = __size;
    puVar7 = (uchar *)malloc(__size);
    *out = puVar7;
    if (puVar7 == (uchar *)0x0 && __size != 0) {
      return 0x53;
    }
    if ((7 < uVar5) || (uVar12 = sVar10 + 7 & 0xffffffff8, sVar10 - uVar12 == 0)) {
      uVar6 = filter(puVar7,in,w,h,color,settings);
      return uVar6;
    }
    out_00 = (uchar *)malloc(__size_00);
    uVar6 = 0x53;
    if (out_00 != (uchar *)0x0) {
      addPaddingBits(out_00,in,uVar12,sVar10,h);
      uVar6 = filter(puVar7,out_00,w,h,color,settings);
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar5);
    *outsize = filter_passstart[7];
    puVar7 = (uchar *)malloc(filter_passstart[7]);
    *out = puVar7;
    out_00 = (uchar *)malloc(passstart[7]);
    uVar6 = 0x53;
    if (puVar7 != (uchar *)0x0 && (passstart[7] == 0 || out_00 != (uchar *)0x0)) {
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_138,w,h,uVar5)
      ;
      if (uVar5 < 8) {
        lVar9 = 0;
        do {
          uVar6 = passh_1[lVar9];
          if (uVar6 != 0) {
            uVar1 = passw_1[lVar9];
            local_298 = 0;
            do {
              if ((ulong)uVar1 != 0) {
                uVar17 = ADAM7_DY[lVar9];
                uVar2 = ADAM7_IY[lVar9];
                uVar3 = ADAM7_DX[lVar9];
                sVar10 = local_138[lVar9];
                uVar4 = ADAM7_IX[lVar9];
                uVar13 = 0;
                do {
                  if (uVar5 != 0) {
                    uVar15 = (ulong)((uVar1 * local_298 + (int)uVar13) * uVar5) + sVar10 * 8;
                    uVar11 = (ulong)((uVar3 * (int)uVar13 + (uVar17 * local_298 + uVar2) * w + uVar4
                                     ) * uVar5);
                    uVar8 = uVar12;
                    do {
                      bVar16 = '\x01' << (~(byte)uVar15 & 7);
                      if ((in[uVar11 >> 3] >> (~(byte)uVar11 & 7) & 1) == 0) {
                        out_00[uVar15 >> 3] = out_00[uVar15 >> 3] & ~bVar16;
                      }
                      else {
                        out_00[uVar15 >> 3] = out_00[uVar15 >> 3] | bVar16;
                      }
                      uVar15 = uVar15 + 1;
                      uVar11 = uVar11 + 1;
                      uVar14 = (int)uVar8 - 1;
                      uVar8 = (ulong)uVar14;
                    } while (uVar14 != 0);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar1);
              }
              local_298 = local_298 + 1;
            } while (local_298 != uVar6);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
      }
      else {
        uVar13 = (ulong)(uVar5 >> 3);
        lVar9 = 0;
        do {
          uVar6 = passh_1[lVar9];
          if ((ulong)uVar6 != 0) {
            uVar8 = (ulong)passw_1[lVar9];
            local_250 = 0;
            local_280 = 0;
            do {
              if (uVar8 != 0) {
                uVar1 = ADAM7_DX[lVar9];
                sVar10 = local_138[lVar9];
                uVar17 = (ADAM7_DY[lVar9] * (int)local_280 + ADAM7_IY[lVar9]) * w + ADAM7_IX[lVar9];
                uVar11 = uVar8;
                uVar15 = local_250;
                do {
                  memcpy(out_00 + (uVar15 & 0xffffffff) * uVar13 + sVar10,in + uVar17 * uVar13,
                         uVar13);
                  uVar17 = uVar17 + uVar1;
                  uVar15 = uVar15 + 1;
                  uVar11 = uVar11 - 1;
                } while (uVar11 != 0);
              }
              local_280 = local_280 + 1;
              local_250 = local_250 + uVar8;
            } while (local_280 != uVar6);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
      }
      lVar9 = 0;
      do {
        if (uVar5 < 8) {
          puVar7 = (uchar *)malloc(*(long *)((long)padded_passstart + lVar9 * 2 + 8) -
                                   *(long *)((long)padded_passstart + lVar9 * 2));
          if (puVar7 == (uchar *)0x0) {
            uVar6 = 0x53;
            goto LAB_001e8223;
          }
          uVar6 = *(uint *)((long)passw + lVar9);
          sVar10 = uVar6 * uVar12;
          uVar1 = *(uint *)((long)passh + lVar9);
          addPaddingBits(puVar7,out_00 + *(long *)((long)passstart + lVar9 * 2),
                         sVar10 + 7 & 0xffffffff8,sVar10,uVar1);
          uVar6 = filter(*out + *(long *)((long)filter_passstart + lVar9 * 2),puVar7,uVar6,uVar1,
                         color,settings);
          free(puVar7);
        }
        else {
          uVar6 = filter(*out + *(long *)((long)filter_passstart + lVar9 * 2),
                         out_00 + *(long *)((long)padded_passstart + lVar9 * 2),
                         *(uint *)((long)passw + lVar9),*(uint *)((long)passh + lVar9),color,
                         settings);
        }
        if (uVar6 != 0) goto LAB_001e8223;
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0x1c);
      uVar6 = 0;
    }
  }
LAB_001e8223:
  free(out_00);
  return uVar6;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  size_t bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;
  if(info_png->interlace_method == 0) {
    /*image size plus an extra byte per scanline + possible padding bits*/
    *outsize = (size_t)h + ((size_t)h * (((size_t)w * bpp + 7u) / 8u));
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && (size_t)w * bpp != (((size_t)w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if(!padded) error = 83; /*alloc fail*/
        if(!error) {
          addPaddingBits(padded, in, (((size_t)w * bpp + 7u) / 8u) * 8u, (size_t)w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      } else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  } else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, (unsigned)bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, (unsigned)bpp);
      for(i = 0; i != 7; ++i) {
        if(bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         (((size_t)passw[i] * bpp + 7u) / 8u) * 8u, (size_t)passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        } else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}